

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::ProcessOrEnqueue
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,S2CellId id,S2ShapeIndexCell *index_cell)

{
  const_reference pvVar1;
  size_type_conflict n;
  int iVar2;
  S2MaxDistance distance;
  S2Cell cell;
  S1ChordAngle local_88;
  value_type local_80;
  undefined1 local_68 [16];
  S2ShapeIndexCell *local_58;
  
  if (index_cell != (S2ShapeIndexCell *)0x0) {
    if (((undefined1  [16])
         (index_cell->shapes_).
         super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
        (undefined1  [16])0xffffff) == (undefined1  [16])0x0) {
      iVar2 = 0;
    }
    else {
      n = 0;
      iVar2 = 0;
      do {
        pvVar1 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                 operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                            index_cell,n);
        iVar2 = iVar2 + (*(uint *)&pvVar1->field_0x4 >> 1);
        n = n + 1;
      } while (n < (*(uint *)&(index_cell->shapes_).
                              super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
                   & 0xffffff));
    }
    if (iVar2 == 0) {
      return;
    }
    if (iVar2 < 10) {
      S1ChordAngle::S1ChordAngle((S1ChordAngle *)local_68,4.0);
      local_68._8_8_ = id.id_;
      local_58 = index_cell;
      ProcessEdges(this,(QueueEntry *)local_68);
      return;
    }
  }
  S2Cell::S2Cell((S2Cell *)local_68,id);
  local_88.length2_ = (this->distance_limit_).distance_.length2_;
  iVar2 = (*this->target_->_vptr_S2DistanceTarget[5])(this->target_,(S2Cell *)local_68);
  if ((char)iVar2 != '\0') {
    if (this->use_conservative_cell_distance_ == true) {
      local_88 = operator+(local_88,(this->options_->max_error_).length2_);
    }
    local_80.distance.distance_.length2_ = (S1ChordAngle)(S1ChordAngle)local_88.length2_;
    local_80.id.id_ = id.id_;
    local_80.index_cell = index_cell;
    std::
    priority_queue<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
    ::push(&this->queue_,&local_80);
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ProcessOrEnqueue(
    S2CellId id, const S2ShapeIndexCell* index_cell) {
  if (index_cell) {
    // If this index cell has only a few edges, then it is faster to check
    // them directly rather than computing the minimum distance to the S2Cell
    // and inserting it into the queue.
    static const int kMinEdgesToEnqueue = 10;
    int num_edges = CountEdges(index_cell);
    if (num_edges == 0) return;
    if (num_edges < kMinEdgesToEnqueue) {
      // Set "distance" to zero to avoid the expense of computing it.
      ProcessEdges(QueueEntry(Distance::Zero(), id, index_cell));
      return;
    }
  }
  // Otherwise compute the minimum distance to any point in the cell and add
  // it to the priority queue.
  S2Cell cell(id);
  Distance distance = distance_limit_;
  if (!target_->UpdateMinDistance(cell, &distance)) return;
  if (use_conservative_cell_distance_) {
    // Ensure that "distance" is a lower bound on the true distance to the cell.
    distance = distance - options().max_error();  // operator-=() not defined.
  }
  queue_.push(QueueEntry(distance, id, index_cell));
}